

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseIncoming.cpp
# Opt level: O2

Result __thiscall
tonk::SessionIncoming::onCompressed(SessionIncoming *this,uint8_t *data,uint bytes)

{
  Result RVar1;
  RefCounter *pRVar2;
  Decompressed *in_RCX;
  Result *success;
  uint uVar3;
  int iVar4;
  uint uVar5;
  allocator local_69;
  Result decompressResult;
  string local_60 [32];
  Decompressed decompressed;
  
  if ((int)in_RCX == 0) {
    (this->Deps).ConnectionRef = (RefCounter *)0x0;
  }
  else {
    MessageDecompressor::Decompress
              ((MessageDecompressor *)&decompressResult,data + 0x4b8,bytes,in_RCX);
    RVar1 = decompressResult;
    if (decompressResult.Error == (ErrorResult *)0x0) {
      uVar5 = 0;
      while (1 < decompressed.Bytes - uVar5) {
        iVar4 = uVar5 + 2;
        uVar3 = *(ushort *)(decompressed.Data + uVar5) & 0x7ff;
        if (decompressed.Bytes - iVar4 < uVar3) {
          std::__cxx11::string::string(local_60,"Truncated message",&local_69);
          pRVar2 = (RefCounter *)operator_new(0x38);
          *(char **)pRVar2 = "SessionIncoming::decompress";
          std::__cxx11::string::string((string *)&pRVar2->ShutdownJson,local_60);
          goto LAB_00151412;
        }
        deliverMessage(this,(uint)data,
                       (uint8_t *)(ulong)(*(ushort *)(decompressed.Data + uVar5) >> 0xb),
                       iVar4 + (int)decompressed.Data);
        if ((this->Deps).ConnectionRef != (RefCounter *)0x0) goto LAB_0015142c;
        Result::~Result((Result *)this);
        uVar5 = iVar4 + uVar3;
      }
      if (decompressed.Bytes == uVar5) {
        (this->Deps).ConnectionRef = (RefCounter *)0x0;
      }
      else {
        std::__cxx11::string::string(local_60,"Invalid frame",&local_69);
        pRVar2 = (RefCounter *)operator_new(0x38);
        *(char **)pRVar2 = "SessionIncoming::decompress";
        std::__cxx11::string::string((string *)&pRVar2->ShutdownJson,local_60);
LAB_00151412:
        (pRVar2->RefCount).super___atomic_base<int>._M_i = 0;
        (pRVar2->ShutdownLock).super___mutex_base._M_mutex.__align = 9;
        (this->Deps).ConnectionRef = pRVar2;
        std::__cxx11::string::~string(local_60);
      }
    }
    else {
      decompressResult.Error = (ErrorResult *)0x0;
      (this->Deps).ConnectionRef = (RefCounter *)RVar1.Error;
    }
LAB_0015142c:
    Result::~Result(&decompressResult);
  }
  return (Result)(ErrorResult *)this;
}

Assistant:

Result SessionIncoming::onCompressed(
    const uint8_t* data,
    unsigned bytes)
{
    if (bytes <= 0) {
        return Result::Success();
    }

    Decompressed decompressed;
    Result decompressResult = Decompressor.Decompress(
        data,
        bytes,
        decompressed);
    if (decompressResult.IsFail()) {
        return decompressResult;
    }

    siamese::ReadByteStream frameReader(decompressed.Data, decompressed.Bytes);

    // Process all messages contained in the compressed payload:
    while (frameReader.Remaining() >= protocol::kMessageFrameBytes)
    {
        // Read message frame header
        unsigned messageType = frameReader.Read16();
        const unsigned messageBytes = messageType & protocol::kMessageLengthMask;

        if (frameReader.Remaining() < messageBytes) {
            TONK_DEBUG_BREAK();
            return Result("SessionIncoming::decompress", "Truncated message", ErrorType::Tonk, Tonk_InvalidData);
        }

        messageType >>= protocol::kMessageLengthBits;
        const uint8_t* messageData = frameReader.Read(messageBytes);

        TONK_DEBUG_ASSERT(messageType >= protocol::MessageType_StartOfReliables);
        TONK_DEBUG_ASSERT(messageType != protocol::MessageType_Unordered);

        const Result deliveryResult = deliverMessage(messageType, messageData, messageBytes);
        if (deliveryResult.IsFail()) {
            return deliveryResult;
        }
    }

    // If the message payload was not completely used:
    if (frameReader.Remaining() > 0) {
        TONK_DEBUG_BREAK(); // Invalid data
        return Result("SessionIncoming::decompress", "Invalid frame", ErrorType::Tonk, Tonk_InvalidData);
    }

    return Result::Success();
}